

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void xmlHashScanFull(xmlHashTablePtr table,xmlHashScannerFull f,void *data)

{
  int iVar1;
  _xmlHashEntry *p_Var2;
  _xmlHashEntry *p_Var3;
  xmlHashEntryPtr next;
  xmlHashEntryPtr iter;
  int nb;
  int i;
  void *data_local;
  xmlHashScannerFull f_local;
  xmlHashTablePtr table_local;
  
  if (((table != (xmlHashTablePtr)0x0) && (f != (xmlHashScannerFull)0x0)) &&
     (table->table != (_xmlHashEntry *)0x0)) {
    for (iter._4_4_ = 0; iter._4_4_ < table->size; iter._4_4_ = iter._4_4_ + 1) {
      if (table->table[iter._4_4_].valid != 0) {
        p_Var3 = table->table + iter._4_4_;
        while (next = p_Var3, next != (xmlHashEntryPtr)0x0) {
          p_Var2 = next->next;
          iVar1 = table->nbElems;
          if ((f != (xmlHashScannerFull)0x0) && (next->payload != (void *)0x0)) {
            (*f)(next->payload,data,next->name,next->name2,next->name3);
          }
          p_Var3 = p_Var2;
          if ((iVar1 != table->nbElems) && (next == table->table + iter._4_4_)) {
            if (table->table[iter._4_4_].valid == 0) {
              next = (xmlHashEntryPtr)0x0;
            }
            p_Var3 = next;
            if (table->table[iter._4_4_].next != p_Var2) {
              p_Var3 = table->table + iter._4_4_;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
xmlHashScanFull(xmlHashTablePtr table, xmlHashScannerFull f, void *data) {
    int i, nb;
    xmlHashEntryPtr iter;
    xmlHashEntryPtr next;

    if (table == NULL)
	return;
    if (f == NULL)
	return;

    if (table->table) {
	for(i = 0; i < table->size; i++) {
	    if (table->table[i].valid == 0)
		continue;
	    iter = &(table->table[i]);
	    while (iter) {
		next = iter->next;
                nb = table->nbElems;
		if ((f != NULL) && (iter->payload != NULL))
		    f(iter->payload, data, iter->name,
		      iter->name2, iter->name3);
                if (nb != table->nbElems) {
                    /* table was modified by the callback, be careful */
                    if (iter == &(table->table[i])) {
                        if (table->table[i].valid == 0)
                            iter = NULL;
                        if (table->table[i].next != next)
			    iter = &(table->table[i]);
                    } else
		        iter = next;
                } else
		    iter = next;
	    }
	}
    }
}